

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_scheduler.cpp
# Opt level: O1

void async::detail::thread_task_loop
               (threadpool_data *impl,size_t thread_id,task_wait_handle wait_task)

{
  atomic<unsigned_long> *paVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  __pointer_type pcVar5;
  __int_type _Var6;
  task_wait_event **pptVar7;
  task_wait_event *ptVar8;
  threadpool_data *ptVar9;
  task_run_handle tVar10;
  bool bVar11;
  __pid_t _Var12;
  unsigned_long uVar13;
  undefined8 extraout_RAX;
  undefined8 uVar14;
  undefined1 auVar15 [8];
  thread_data_t *ptVar16;
  __int_type _Var17;
  byte bVar18;
  task_ptr tVar19;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  char cVar20;
  task_run_handle t_1;
  task_run_handle t;
  task_wait_event event;
  task_run_handle local_d8;
  allocator_type local_c9;
  undefined1 local_c8 [8];
  bool local_c0;
  undefined7 uStack_bf;
  ulong local_b0;
  long local_a8;
  thread_data_t *local_a0;
  task_wait_event local_98;
  
  local_a8 = thread_id * 0x40;
  local_a0 = (impl->thread_data).ptr + thread_id;
  local_98.event_mask = 0;
  local_98.initialized = false;
  local_b0 = 0;
LAB_00104bc4:
  do {
    if (wait_task.handle != (task_base *)0x0) {
      if ((local_b0 & 1) == 0) {
        if ((byte)(((wait_task.handle)->state)._M_i - completed) < 2) goto LAB_00104f84;
      }
      else {
        bVar11 = task_wait_event::try_wait(&local_98,1);
        if (bVar11) goto LAB_00104f84;
      }
    }
    work_steal_queue::pop(&local_a0->queue);
    auVar15 = local_c8;
    if (local_c8 == (undefined1  [8])0x0) {
      task_run_handle::~task_run_handle((task_run_handle *)local_c8);
    }
    else {
      (*(*(task_base_vtable **)((long)local_c8 + 0x18))->run)((task_base *)local_c8);
      if (local_c8 != (undefined1  [8])0x0) {
        LOCK();
        *(long *)local_c8 = *(long *)local_c8 + -1;
        UNLOCK();
        if (*(long *)local_c8 == 0) {
          (*(*(task_base_vtable **)((long)local_c8 + 0x18))->destroy)((task_base *)local_c8);
        }
      }
      local_c8 = (undefined1  [8])0x0;
      task_run_handle::~task_run_handle((task_run_handle *)local_c8);
      if (auVar15 != (undefined1  [8])0x0) goto LAB_00104bc4;
    }
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c8,
                 (impl->thread_data).length,&local_c9);
      __last._M_current._1_7_ = uStack_bf;
      __last._M_current._0_1_ = local_c0;
      if (local_c8 != (undefined1  [8])__last._M_current) {
        uVar13 = 0;
        auVar15 = local_c8;
        do {
          *(unsigned_long *)auVar15 = uVar13;
          uVar13 = uVar13 + 1;
          auVar15 = (undefined1  [8])((long)auVar15 + 8);
        } while (auVar15 != (undefined1  [8])__last._M_current);
      }
      std::
      shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>&>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )local_c8,__last,
                 (linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL> *)
                 ((long)&(((impl->thread_data).ptr)->rng)._M_x + local_a8));
      ptVar9 = (threadpool_data *)CONCAT71(uStack_bf,local_c0);
      for (tVar19.p = (task_base *)local_c8; (threadpool_data *)tVar19.p != ptVar9;
          tVar19.p = (task_base *)&(tVar19.p)->state) {
        sVar2 = (((mutex *)
                 &(tVar19.p)->
                  super_ref_count_base<async::detail::task_base,_async::detail::task_base_deleter>)
                ->super___mutex_base)._M_mutex.__align;
        cVar20 = '\x03';
        if (sVar2 != thread_id) {
          ptVar16 = (impl->thread_data).ptr + sVar2;
          do {
            uVar3 = (ptVar16->queue).top.super___atomic_base<unsigned_long>._M_i;
            uVar4 = (ptVar16->queue).bottom.super___atomic_base<unsigned_long>._M_i;
            if (uVar4 == uVar3 || (long)(uVar4 - uVar3) < 0) {
              local_d8.handle.p = (task_ptr)(task_base *)0x0;
              break;
            }
            pcVar5 = (ptVar16->queue).array._M_b._M_p;
            local_d8.handle.p = (task_ptr)(pcVar5->items).ptr[(pcVar5->items).length - 1 & uVar3];
            __last._M_current = (unsigned_long *)(uVar3 + 1);
            paVar1 = &(ptVar16->queue).top;
            LOCK();
            bVar11 = uVar3 == (paVar1->super___atomic_base<unsigned_long>)._M_i;
            if (bVar11) {
              (paVar1->super___atomic_base<unsigned_long>)._M_i = (__int_type)__last._M_current;
            }
            UNLOCK();
          } while (!bVar11);
          cVar20 = local_d8.handle.p != (task_base *)0x0;
          if (!(bool)cVar20) {
            task_run_handle::~task_run_handle(&local_d8);
          }
        }
        if ((cVar20 != '\x03') && (cVar20 != '\0')) goto LAB_00104d28;
      }
      local_d8.handle.p = (task_ptr)(task_base *)0x0;
LAB_00104d28:
      if (local_c8 != (undefined1  [8])0x0) {
        operator_delete((void *)local_c8);
      }
      tVar10.handle.p = local_d8.handle.p;
      if (local_d8.handle.p == (task_base *)0x0) {
        task_run_handle::~task_run_handle(&local_d8);
      }
      else {
        (*(*(task_base_vtable **)((long)local_d8.handle.p + 0x18))->run)
                  ((task_base *)local_d8.handle.p);
        if (local_d8.handle.p != (task_base *)0x0) {
          LOCK();
          *(long *)local_d8.handle.p = *(long *)local_d8.handle.p + -1;
          UNLOCK();
          if (*(long *)local_d8.handle.p == 0) {
            (*(*(task_base_vtable **)((long)local_d8.handle.p + 0x18))->destroy)
                      ((task_base *)local_d8.handle.p);
          }
        }
        local_d8.handle.p = (task_ptr)(task_base *)0x0;
        task_run_handle::~task_run_handle(&local_d8);
        if (tVar10.handle.p != (task_base *)0x0) goto LAB_00104bc4;
      }
      local_c0 = false;
      local_c8 = (undefined1  [8])impl;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c8);
      local_c0 = true;
      sVar2 = (impl->public_queue).head;
      if (sVar2 == (impl->public_queue).tail) {
        tVar19.p = (task_base *)0x0;
      }
      else {
        tVar19.p = (task_base *)(impl->public_queue).items.ptr[sVar2];
        (impl->public_queue).head = (impl->public_queue).items.length - 1 & sVar2 + 1;
      }
      if (tVar19.p == (task_base *)0x0) {
        bVar18 = 0;
      }
      else {
        local_d8.handle.p = (task_ptr)(task_ptr)tVar19.p;
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_c8);
        (*(*(task_base_vtable **)((long)local_d8.handle.p + 0x18))->run)();
        if (local_d8.handle.p != (task_base *)0x0) {
          LOCK();
          *(long *)local_d8.handle.p = *(long *)local_d8.handle.p + -1;
          UNLOCK();
          if (*(long *)local_d8.handle.p == 0) {
            (*(*(task_base_vtable **)((long)local_d8.handle.p + 0x18))->destroy)
                      ((task_base *)local_d8.handle.p);
          }
        }
        bVar18 = 5;
      }
      local_d8.handle.p = (task_ptr)(task_base *)0x0;
      task_run_handle::~task_run_handle(&local_d8);
      if ((tVar19.p == (task_base *)0x0) &&
         ((wait_task.handle != (task_base *)0x0 || (bVar18 = 1, impl->shutdown == false)))) {
        if (local_98.initialized == false) {
          local_98.m[0x10] = '\0';
          local_98.m[0x11] = '\0';
          local_98.m[0x12] = '\0';
          local_98.m[0x13] = '\0';
          local_98.m[0x14] = '\0';
          local_98.m[0x15] = '\0';
          local_98.m[0x16] = '\0';
          local_98.m[0x17] = '\0';
          local_98.m[0x18] = '\0';
          local_98.m[0x19] = '\0';
          local_98.m[0x1a] = '\0';
          local_98.m[0x1b] = '\0';
          local_98.m[0x1c] = '\0';
          local_98.m[0x1d] = '\0';
          local_98.m[0x1e] = '\0';
          local_98.m[0x1f] = '\0';
          local_98.m[0] = '\0';
          local_98.m[1] = '\0';
          local_98.m[2] = '\0';
          local_98.m[3] = '\0';
          local_98.m[4] = '\0';
          local_98.m[5] = '\0';
          local_98.m[6] = '\0';
          local_98.m[7] = '\0';
          local_98.m[8] = '\0';
          local_98.m[9] = '\0';
          local_98.m[10] = '\0';
          local_98.m[0xb] = '\0';
          local_98.m[0xc] = '\0';
          local_98.m[0xd] = '\0';
          local_98.m[0xe] = '\0';
          local_98.m[0xf] = '\0';
          local_98.m[0x20] = '\0';
          local_98.m[0x21] = '\0';
          local_98.m[0x22] = '\0';
          local_98.m[0x23] = '\0';
          local_98.m[0x24] = '\0';
          local_98.m[0x25] = '\0';
          local_98.m[0x26] = '\0';
          local_98.m[0x27] = '\0';
          std::condition_variable::condition_variable((condition_variable *)local_98.c);
          local_98.initialized = true;
        }
        if ((wait_task.handle != (task_base *)0x0) && ((local_b0 & 1) == 0)) {
          local_d8.handle.p = (task_ptr)aligned_alloc(0x40,0x40);
          (((task_base *)local_d8.handle.p)->
          super_ref_count_base<async::detail::task_base,_async::detail::task_base_deleter>).
          ref_count.super___atomic_base<unsigned_long>._M_i = 1;
          (((task_base *)local_d8.handle.p)->state)._M_i = pending;
          (((task_base *)local_d8.handle.p)->continuations).atomic_data._M_i.data = 0;
          ((task_base *)local_d8.handle.p)->vtable =
               (task_base_vtable *)
               &task_func<async::detail::inline_scheduler_impl,async::task_wait_handle::wait_exec_func<async::detail::thread_task_loop(async::detail::threadpool_data*,unsigned_long,async::task_wait_handle)::$_0>,async::detail::fake_void>
                ::vtable_impl;
          *(task_wait_event **)&((task_base *)local_d8.handle.p)->field_0x28 = &local_98;
          __last._M_current = (unsigned_long *)&inline_scheduler()::instance;
          *(undefined1 **)&((task_base *)local_d8.handle.p)->field_0x20 =
               &inline_scheduler()::instance;
          task_base::add_continuation<async::detail::inline_scheduler_impl>
                    (wait_task.handle,(inline_scheduler_impl *)&inline_scheduler()::instance,
                     &local_d8.handle);
          uVar14 = extraout_RAX;
          if (local_d8.handle.p != (task_base *)0x0) {
            LOCK();
            *(long *)local_d8.handle.p = *(long *)local_d8.handle.p + -1;
            UNLOCK();
            if (*(long *)local_d8.handle.p == 0) {
              uVar14 = (*(*(task_base_vtable **)((long)local_d8.handle.p + 0x18))->destroy)
                                 ((task_base *)local_d8.handle.p);
            }
          }
          local_b0 = CONCAT71((int7)((ulong)uVar14 >> 8),1);
        }
        _Var6 = (impl->num_waiters).super___atomic_base<unsigned_long>._M_i;
        (impl->waiters)._M_t.
        super___uniq_ptr_impl<async::detail::task_wait_event_*,_std::default_delete<async::detail::task_wait_event_*[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_async::detail::task_wait_event_**,_std::default_delete<async::detail::task_wait_event_*[]>_>
        .super__Head_base<0UL,_async::detail::task_wait_event_**,_false>._M_head_impl[_Var6] =
             &local_98;
        (impl->num_waiters).super___atomic_base<unsigned_long>._M_i = _Var6 + 1;
        std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_c8);
        _Var12 = task_wait_event::wait(&local_98,__last._M_current);
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c8);
        _Var6 = (impl->num_waiters).super___atomic_base<unsigned_long>._M_i;
        if (_Var6 != 0) {
          pptVar7 = (impl->waiters)._M_t.
                    super___uniq_ptr_impl<async::detail::task_wait_event_*,_std::default_delete<async::detail::task_wait_event_*[]>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_async::detail::task_wait_event_**,_std::default_delete<async::detail::task_wait_event_*[]>_>
                    .super__Head_base<0UL,_async::detail::task_wait_event_**,_false>._M_head_impl;
          _Var17 = 0;
          do {
            ptVar8 = pptVar7[_Var17];
            if (ptVar8 == &local_98) {
              if (_Var6 - 1 != _Var17) {
                pptVar7[_Var17] = pptVar7[_Var6 - 1];
                pptVar7[_Var6 - 1] = ptVar8;
              }
              (impl->num_waiters).super___atomic_base<unsigned_long>._M_i = _Var6 - 1;
              break;
            }
            _Var17 = _Var17 + 1;
          } while (_Var6 != _Var17);
        }
        bVar18 = (byte)_Var12 & wait_task.handle != (task_base *)0x0;
      }
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c8);
    } while (bVar18 == 0);
    if (bVar18 != 5) {
LAB_00104f84:
      if (local_98.initialized == true) {
        std::condition_variable::~condition_variable((condition_variable *)local_98.c);
      }
      return;
    }
  } while( true );
}

Assistant:

static void thread_task_loop(threadpool_data* impl, std::size_t thread_id, task_wait_handle wait_task)
{
	// Get our thread's data
	thread_data_t& current_thread = impl->thread_data[thread_id];

	// Flag indicating if we have added a continuation to the task
	bool added_continuation = false;

	// Event to wait on
	task_wait_event event;

	// Loop while waiting for the task to complete
	while (true) {
		// Check if the task has finished. If we have added a continuation, we
		// need to make sure the event has been signaled, otherwise the other
		// thread may try to signal it after we have freed it.
		if (wait_task && (added_continuation ? event.try_wait(wait_type::task_finished) : wait_task.ready()))
			return;

		// Try to get a task from the local queue
		if (task_run_handle t = current_thread.queue.pop()) {
			t.run();
			continue;
		}

		// Stealing loop
		while (true) {
			// Try to steal a task
			if (task_run_handle t = steal_task(impl, thread_id)) {
				t.run();
				break;
			}

			// Try to fetch from the public queue
			std::unique_lock<std::mutex> locked(impl->lock);
			if (task_run_handle t = impl->public_queue.pop()) {
				// Don't hold the lock while running the task
				locked.unlock();
				t.run();
				break;
			}

			// If shutting down and we don't have a task to wait for, return.
			if (!wait_task && impl->shutdown) {
#ifdef BROKEN_JOIN_IN_DESTRUCTOR
				// Notify once all worker threads have exited
				if (--impl->shutdown_num_threads == 0)
					impl->shutdown_complete_event.notify_one();
#endif
				return;
			}

			// Initialize the event object
			event.init();

			// No tasks found, so sleep until something happens.
			// If a continuation has not been added yet, add it.
			if (wait_task && !added_continuation) {
				// Create a continuation for the task we are waiting for
				wait_task.on_finish([&event] {
					// Signal the thread's event
					event.signal(wait_type::task_finished);
				});
				added_continuation = true;
			}

			// Add our thread to the list of waiting threads
			size_t num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
			impl->waiters[num_waiters_val] = &event;
			impl->num_waiters.store(num_waiters_val + 1, std::memory_order_relaxed);

			// Wait for our event to be signaled when a task is scheduled or
			// the task we are waiting for has completed.
			locked.unlock();
			int events = event.wait();
			locked.lock();

			// Remove our thread from the list of waiting threads
			num_waiters_val = impl->num_waiters.load(std::memory_order_relaxed);
			for (std::size_t i = 0; i < num_waiters_val; i++) {
				if (impl->waiters[i] == &event) {
					if (i != num_waiters_val - 1)
						std::swap(impl->waiters[i], impl->waiters[num_waiters_val - 1]);
					impl->num_waiters.store(num_waiters_val - 1, std::memory_order_relaxed);
					break;
				}
			}

			// Check again if the task has finished. We have added a
			// continuation at this point, so we need to check that the
			// continuation has finished signaling the event.
			if (wait_task && (events & wait_type::task_finished))
				return;
		}
	}
}